

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  SessionWriter *pSVar3;
  __atomic_base<unsigned_long> _Var4;
  nanoseconds nVar5;
  cx_string<123UL> *in_RCX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  PartiallyAdaptedEnum *in_R9;
  allocator local_453;
  allocator local_452;
  allocator local_451;
  PartiallyAdaptedEnum local_450;
  PartiallyAdaptedEnum local_44c;
  PartiallyAdaptedEnum local_448;
  allocator local_442;
  allocator local_441;
  cx_string<123UL> local_440;
  undefined1 local_3c0 [48];
  string local_390 [32];
  string local_370 [32];
  uint64_t local_350;
  string local_348 [32];
  string local_328 [32];
  undefined1 local_308 [48];
  string local_2d8 [32];
  string local_2b8 [32];
  uint64_t local_298;
  string local_290 [32];
  string local_270 [32];
  undefined1 local_250 [48];
  string local_220 [32];
  string local_200 [32];
  uint64_t local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [48];
  string local_168 [32];
  string local_148 [32];
  uint64_t local_128;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",(allocator *)&local_44c);
      std::__cxx11::string::string(local_b0,"main",(allocator *)&local_450);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,(allocator *)&local_448);
      local_70 = 0x26;
      std::__cxx11::string::string(local_68,"Enum: {}",&local_452);
      local_440._data._0_2_ = 0x49;
      std::__cxx11::string::string(local_48,local_440._data,&local_453);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = &local_440;
    local_440._data[0] = '{';
    local_440._data[1] = '\0';
    local_440._data[2] = '\0';
    local_440._data[3] = '\0';
    binlog::SessionWriter::addEvent<Enum>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Enum *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_198._0_8_ = 0;
      local_198._8_2_ = info;
      std::__cxx11::string::string((string *)(local_198 + 0x10),"main",(allocator *)&local_450);
      std::__cxx11::string::string(local_168,"main",(allocator *)&local_448);
      std::__cxx11::string::string
                (local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_452);
      local_128 = 0x2c;
      std::__cxx11::string::string(local_120,"Adapted enum: {}",&local_453);
      local_44c = 1;
      binlog::detail::concatenated_tags<char_const(&)[17],AdaptedEnum>
                ((cx_string<32UL> *)&local_440,(detail *)"Adapted enum: {}",
                 (char (*) [17])&local_44c,(AdaptedEnum *)in_RCX);
      std::__cxx11::string::string(local_100,local_440._data,&local_451);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_198);
      binlog::EventSource::~EventSource((EventSource *)local_198);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = &local_440;
    local_440._data[0] = '\x01';
    local_440._data[1] = '\0';
    local_440._data[2] = '\0';
    local_440._data[3] = '\0';
    binlog::SessionWriter::addEvent<AdaptedEnum>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (AdaptedEnum *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_250._0_8_ = 0;
      local_250._8_2_ = info;
      std::__cxx11::string::string((string *)(local_250 + 0x10),"main",(allocator *)&local_450);
      std::__cxx11::string::string(local_220,"main",(allocator *)&local_448);
      std::__cxx11::string::string
                (local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_452);
      local_1e0 = 0x32;
      std::__cxx11::string::string(local_1d8,"Scoped enum: {}",&local_453);
      local_44c = 0;
      binlog::detail::concatenated_tags<char_const(&)[16],ScopedEnum>
                ((cx_string<31UL> *)&local_440,(detail *)"Scoped enum: {}",(char (*) [16])&local_44c
                 ,(ScopedEnum *)in_RCX);
      std::__cxx11::string::string(local_1b8,local_440._data,&local_451);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_250);
      binlog::EventSource::~EventSource((EventSource *)local_250);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = &local_440;
    local_440._data[0] = '\0';
    local_440._data[1] = '\0';
    local_440._data[2] = '\0';
    local_440._data[3] = '\0';
    binlog::SessionWriter::addEvent<ScopedEnum>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (ScopedEnum *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_308._0_8_ = 0;
      local_308._8_2_ = info;
      std::__cxx11::string::string((string *)(local_308 + 0x10),"main",&local_452);
      std::__cxx11::string::string(local_2d8,"main",&local_453);
      std::__cxx11::string::string
                (local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_451);
      local_298 = 0x37;
      std::__cxx11::string::string(local_290,"Partially adapted enum: {} {} {}",&local_441);
      local_44c = Rho;
      local_450 = Sigma;
      local_448 = Tau;
      binlog::detail::
      concatenated_tags<char_const(&)[33],PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
                (&local_440,(detail *)"Partially adapted enum: {} {} {}",(char (*) [33])&local_44c,
                 &local_450,&local_448,in_R9);
      std::__cxx11::string::string(local_270,local_440._data,&local_442);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_308);
      binlog::EventSource::~EventSource((EventSource *)local_308);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = &local_440;
    local_440._data[0] = '\x14';
    local_440._data[1] = '\0';
    local_440._data[2] = '\0';
    local_440._data[3] = '\0';
    local_44c = Sigma;
    local_450 = Tau;
    binlog::SessionWriter::addEvent<PartiallyAdaptedEnum,PartiallyAdaptedEnum,PartiallyAdaptedEnum>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (PartiallyAdaptedEnum *)in_RCX,&local_44c,&local_450);
  }
  pSVar3 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_3c0._0_8_ = 0;
      local_3c0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_3c0 + 0x10),"main",(allocator *)&local_450);
      std::__cxx11::string::string(local_390,"main",(allocator *)&local_448);
      std::__cxx11::string::string
                (local_370,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingEnums.cpp"
                 ,&local_452);
      local_350 = 0x3a;
      std::__cxx11::string::string(local_348,"Shadowed enum type: {}",&local_453);
      local_44c = 0;
      binlog::detail::concatenated_tags<char_const(&)[23],Nest::Nested>
                ((cx_string<19UL> *)&local_440,(detail *)"Shadowed enum type: {}",
                 (char (*) [23])&local_44c,(Nested *)in_RCX);
      std::__cxx11::string::string(local_328,local_440._data,&local_451);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_3c0);
      binlog::EventSource::~EventSource((EventSource *)local_3c0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_440._data[0] = '\0';
    local_440._data[1] = '\0';
    local_440._data[2] = '\0';
    local_440._data[3] = '\0';
    binlog::SessionWriter::addEvent<Nest::Nested>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Nested *)&local_440);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)&local_440,(binlog *)&std::cout,out);
  return 0;
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}